

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O1

void StripWhiteSpace(string *str)

{
  _Base_ptr p_Var1;
  bool bVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  const_iterator __pos;
  uint uVar7;
  ulong uVar8;
  char *pcVar9;
  char *pcVar10;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ctemplate_htmlparser::HtmlParser*>,std::_Select1st<std::pair<std::__cxx11::string_const,ctemplate_htmlparser::HtmlParser*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ctemplate_htmlparser::HtmlParser*>>>
  *this;
  ulong unaff_R12;
  uint uVar11;
  ulong unaff_R13;
  ulong uVar12;
  ulong uVar13;
  pointer pcVar14;
  tuple<> tStack_71;
  _Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
  _Stack_70;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ctemplate_htmlparser::HtmlParser*>,std::_Select1st<std::pair<std::__cxx11::string_const,ctemplate_htmlparser::HtmlParser*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ctemplate_htmlparser::HtmlParser*>>>
  *p_Stack_68;
  ulong uStack_60;
  ulong uStack_58;
  ulong uStack_50;
  code *pcStack_48;
  string *psStack_40;
  
  uVar6 = str->_M_string_length;
  uVar7 = (uint)uVar6;
  uVar12 = uVar6;
  if ((int)uVar7 < 1) {
    uVar13 = 0;
  }
  else {
    unaff_R12 = (ulong)(uVar7 & 0x7fffffff);
    uVar13 = 0;
    do {
      uVar8 = uVar6;
      if (uVar6 == uVar13) goto LAB_00108333;
      psStack_40 = (string *)0x10825f;
      iVar3 = isspace((int)(str->_M_dataplus)._M_p[uVar13]);
      if (iVar3 == 0) goto LAB_00108273;
      uVar13 = uVar13 + 1;
    } while (unaff_R12 != uVar13);
    uVar13 = uVar6 & 0xffffffff;
  }
LAB_00108273:
  uVar7 = uVar7 - (int)uVar13;
  if (uVar7 == 0) {
    str->_M_string_length = 0;
    pcVar14 = (str->_M_dataplus)._M_p;
  }
  else {
    if ((int)uVar13 != 0) {
      psStack_40 = (string *)0x10829a;
      std::__cxx11::string::erase((ulong)str,0);
      uVar12 = (ulong)uVar7;
    }
    iVar3 = (int)uVar12;
    uVar11 = iVar3 - 1;
    unaff_R13 = (ulong)uVar11;
    bVar2 = 0 < iVar3;
    uVar7 = uVar11;
    if (0 < iVar3) {
      uVar6 = str->_M_string_length;
      do {
        iVar3 = (int)uVar12;
        uVar7 = iVar3 - 1;
        uVar8 = (ulong)uVar7;
        unaff_R12 = uVar6;
        uVar13 = uVar8;
        if (uVar6 <= uVar8) goto LAB_00108333;
        psStack_40 = (string *)0x1082c4;
        iVar4 = isspace((int)(str->_M_dataplus)._M_p[uVar8]);
        if (iVar4 == 0) goto LAB_001082df;
        bVar2 = 0 < (int)uVar7;
        uVar12 = (ulong)(iVar3 - 1U);
      } while (iVar3 - 1U != 0 && 0 < iVar3);
      uVar7 = 0xffffffff;
    }
LAB_001082df:
    if ((bool)(~bVar2 & 1U | uVar7 == uVar11)) {
      return;
    }
    uVar13 = (ulong)(uVar7 + 1);
    if (str->_M_string_length < uVar13) goto LAB_0010833a;
    str->_M_string_length = uVar13;
    pcVar14 = (str->_M_dataplus)._M_p + uVar13;
  }
  *pcVar14 = '\0';
  return;
LAB_00108333:
  psStack_40 = (string *)0x10833a;
  std::__throw_out_of_range_fmt
            ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",uVar8,uVar6);
LAB_0010833a:
  pcVar10 = "%s: __pos (which is %zu) > this->size() (which is %zu)";
  pcVar9 = "basic_string::erase";
  psStack_40 = (string *)ctemplate_htmlparser::HtmlParser::HtmlParser;
  std::__throw_out_of_range_fmt
            ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase",uVar13);
  pcStack_48 = (code *)0x10835b;
  this = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ctemplate_htmlparser::HtmlParser*>,std::_Select1st<std::pair<std::__cxx11::string_const,ctemplate_htmlparser::HtmlParser*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ctemplate_htmlparser::HtmlParser*>>>
          *)pcVar10;
  psStack_40 = str;
  lVar5 = ctemplate_htmlparser::htmlparser_new();
  *(long *)pcVar10 = lVar5;
  if (lVar5 == 0) {
    pcStack_48 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                 ::operator[];
    ctemplate_htmlparser::HtmlParser();
    __pos._M_node = (_Base_ptr)(this + 8);
    p_Stack_68 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ctemplate_htmlparser::HtmlParser*>,std::_Select1st<std::pair<std::__cxx11::string_const,ctemplate_htmlparser::HtmlParser*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ctemplate_htmlparser::HtmlParser*>>>
                  *)pcVar10;
    uStack_60 = unaff_R12;
    uStack_58 = unaff_R13;
    uStack_50 = uVar12;
    pcStack_48 = (code *)uVar13;
    for (p_Var1 = *(_Base_ptr *)(this + 0x10); p_Var1 != (_Base_ptr)0x0;
        p_Var1 = (&p_Var1->_M_left)[uVar7 >> 0x1f]) {
      uVar7 = std::__cxx11::string::compare((string *)(p_Var1 + 1));
      if (-1 < (int)uVar7) {
        __pos._M_node = p_Var1;
      }
    }
    if ((__pos._M_node == (_Base_ptr)(this + 8)) ||
       (iVar3 = std::__cxx11::string::compare((string *)pcVar9), iVar3 < 0)) {
      _Stack_70._M_head_impl =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar9;
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ctemplate_htmlparser::HtmlParser*>,std::_Select1st<std::pair<std::__cxx11::string_const,ctemplate_htmlparser::HtmlParser*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ctemplate_htmlparser::HtmlParser*>>>
      ::
      _M_emplace_hint_unique<std::piecewise_construct_t_const&,std::tuple<std::__cxx11::string_const&>,std::tuple<>>
                (this,__pos,(piecewise_construct_t *)&std::piecewise_construct,
                 (tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)&_Stack_70,&tStack_71);
    }
    return;
  }
  return;
}

Assistant:

inline void StripWhiteSpace(std::string* str) {
  int str_length = str->length();

  // Strip off leading whitespace.
  int first = 0;
  while (first < str_length && isspace(str->at(first))) {
    ++first;
  }
  // If entire string is white space.
  if (first == str_length) {
    str->clear();
    return;
  }
  if (first > 0) {
    str->erase(0, first);
    str_length -= first;
  }

  // Strip off trailing whitespace.
  int last = str_length - 1;
  while (last >= 0 && isspace(str->at(last))) {
    --last;
  }
  if (last != (str_length - 1) && last >= 0) {
    str->erase(last + 1, std::string::npos);
  }
}